

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O0

int __thiscall
baryonyx::itm::
solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> pcVar1;
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> *ppcVar2;
  __tuple_element_t<1UL,_tuple<col_value_*,_col_value_*>_> *ppcVar3;
  type pdVar4;
  type prVar5;
  double dVar6;
  undefined1 local_50 [8];
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  double sum_a_p;
  double sum_a_pi;
  int r_size;
  bit_array *x_local;
  row_iterator end_local;
  row_iterator begin_local;
  solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  *this_local;
  
  sum_a_pi._4_4_ = 0;
  for (end_local = begin; end_local != end; end_local = end_local + 1) {
    sum_a_p = 0.0;
    ht.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (col_value *)0x0;
    sparse_matrix<int>::column((sparse_matrix<int> *)local_50,(int)this + 0x10);
    while( true ) {
      ppcVar2 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)local_50);
      pcVar1 = *ppcVar2;
      ppcVar3 = std::
                get<1ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)local_50);
      if (pcVar1 == *ppcVar3) break;
      ppcVar2 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)local_50);
      pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         (&this->pi,(long)(*ppcVar2)->row);
      sum_a_p = *pdVar4 + sum_a_p;
      ppcVar2 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)local_50);
      pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         (&this->P,(long)(*ppcVar2)->value);
      ht.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
           (col_value *)
           (*pdVar4 +
           ht.
           super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
           .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl);
      ppcVar2 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)local_50);
      *ppcVar2 = *ppcVar2 + 1;
    }
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[](&this->R,(long)sum_a_pi._4_4_);
    prVar5->id = sum_a_pi._4_4_;
    dVar6 = default_cost_type<double>::operator()(this->c,end_local->column,x);
    dVar6 = (dVar6 - sum_a_p) -
            (double)ht.
                    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                    _M_head_impl;
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::operator[](&this->R,(long)sum_a_pi._4_4_);
    prVar5->value = dVar6;
    sum_a_pi._4_4_ = sum_a_pi._4_4_ + 1;
  }
  return sum_a_pi._4_4_;
}

Assistant:

int compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                              sparse_matrix<int>::row_iterator end,
                              const Xtype& x) noexcept
    {
        int r_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                sum_a_pi += pi[std::get<0>(ht)->row];
                sum_a_p += P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;

            ++r_size;
        }

        return r_size;
    }